

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_binsr_w_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int iVar1;
  uint uVar2;
  fpr_t *pfVar3;
  uint uVar4;
  
  pfVar3 = (env->active_fpu).fpr + wd;
  uVar4 = (env->active_fpu).fpr[ws].fs[0];
  uVar2 = (env->active_fpu).fpr[wt].fs[0] & 0x1f;
  iVar1 = uVar2 + 1;
  if (iVar1 != 0x20) {
    uVar4 = uVar4 & (uint)(0xffffffffL >> ((byte)uVar2 ^ 0x1f)) |
            (uint)(-1L << (sbyte)iVar1) & pfVar3->fs[0];
  }
  pfVar3->fs[0] = uVar4;
  uVar4 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) & 0x1f;
  iVar1 = uVar2 + 1;
  if (iVar1 != 0x20) {
    uVar4 = uVar4 & (uint)(0xffffffffL >> ((byte)uVar2 ^ 0x1f)) |
            (uint)(-1L << (sbyte)iVar1) &
            *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = uVar4;
  uVar4 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) & 0x1f;
  iVar1 = uVar2 + 1;
  if (iVar1 != 0x20) {
    uVar4 = uVar4 & (uint)(0xffffffffL >> ((byte)uVar2 ^ 0x1f)) |
            (uint)(-1L << (sbyte)iVar1) &
            *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar4;
  uVar4 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) & 0x1f;
  iVar1 = uVar2 + 1;
  if (iVar1 != 0x20) {
    uVar4 = uVar4 & (uint)(0xffffffffL >> ((byte)uVar2 ^ 0x1f)) |
            (uint)(-1L << (sbyte)iVar1) &
            *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = uVar4;
  return;
}

Assistant:

void helper_msa_binsr_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_binsr_df(DF_WORD, pwd->w[0],  pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_binsr_df(DF_WORD, pwd->w[1],  pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_binsr_df(DF_WORD, pwd->w[2],  pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_binsr_df(DF_WORD, pwd->w[3],  pws->w[3],  pwt->w[3]);
}